

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void MoveBeforeTable(TidyDocImpl *doc,Node *row,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  
  for (pNVar2 = (doc->root).parent; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->parent) {
    if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_TABLE)) goto LAB_00129be8;
  }
  pNVar2 = (doc->root).parent;
LAB_00129be8:
  pNVar1 = pNVar2->parent;
  row->parent = pNVar1;
  row->next = pNVar2;
  row->prev = pNVar2->prev;
  pNVar2->prev = row;
  if (row->prev != (Node *)0x0) {
    row->prev->next = row;
  }
  if (pNVar1->content != pNVar2) {
    return;
  }
  pNVar1->content = row;
  return;
}

Assistant:

static void MoveBeforeTable( TidyDocImpl* ARG_UNUSED(doc), Node *row,
                             Node *node )
{
    Node *table;

    /* first find the table element */
    for (table = row->parent; table; table = table->parent)
    {
        if ( nodeIsTABLE(table) )
        {
            TY_(InsertNodeBeforeElement)( table, node );
            return;
        }
    }
    /* No table element */
    TY_(InsertNodeBeforeElement)( row->parent, node );
}